

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

void GetWin32EscapedString(string *input,string *result)

{
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  size_type sVar7;
  char cVar8;
  bool bVar9;
  
  if (result == (string *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util.cc",
                  0x130,"void GetWin32EscapedString(const string &, string *)");
  }
  uVar1 = input->_M_string_length;
  bVar9 = uVar1 != 0;
  if (bVar9) {
    pbVar2 = (byte *)(input->_M_dataplus)._M_p;
    if ((*pbVar2 & 0xfd) == 0x20) goto LAB_0012159f;
    uVar3 = 1;
    do {
      uVar6 = uVar3;
      if (uVar1 == uVar6) break;
      uVar3 = uVar6 + 1;
    } while ((pbVar2[uVar6] & 0xfd) != 0x20);
    bVar9 = uVar6 < uVar1;
  }
  if (!bVar9) {
    std::__cxx11::string::_M_append((char *)result,(ulong)(input->_M_dataplus)._M_p);
    return;
  }
LAB_0012159f:
  std::__cxx11::string::push_back((char)result);
  pcVar5 = (input->_M_dataplus)._M_p;
  sVar7 = input->_M_string_length;
  cVar8 = '\0';
  pcVar4 = pcVar5;
  do {
    if (sVar7 == 0) {
      std::__cxx11::string::replace
                ((ulong)result,result->_M_string_length,(char *)0x0,(ulong)pcVar4);
      std::__cxx11::string::_M_replace_aux((ulong)result,result->_M_string_length,0,cVar8);
      std::__cxx11::string::push_back((char)result);
      return;
    }
    if (*pcVar5 == '\"') {
      std::__cxx11::string::replace
                ((ulong)result,result->_M_string_length,(char *)0x0,(ulong)pcVar4);
      std::__cxx11::string::_M_replace_aux((ulong)result,result->_M_string_length,0,cVar8 + '\x01');
      pcVar4 = pcVar5;
LAB_00121605:
      cVar8 = '\0';
    }
    else {
      if (*pcVar5 != '\\') goto LAB_00121605;
      cVar8 = cVar8 + '\x01';
    }
    pcVar5 = pcVar5 + 1;
    sVar7 = sVar7 - 1;
  } while( true );
}

Assistant:

void GetWin32EscapedString(const string& input, string* result) {
  assert(result);
  if (!StringNeedsWin32Escaping(input)) {
    result->append(input);
    return;
  }

  const char kQuote = '"';
  const char kBackslash = '\\';

  result->push_back(kQuote);
  size_t consecutive_backslash_count = 0;
  string::const_iterator span_begin = input.begin();
  for (string::const_iterator it = input.begin(), end = input.end(); it != end;
       ++it) {
    switch (*it) {
      case kBackslash:
        ++consecutive_backslash_count;
        break;
      case kQuote:
        result->append(span_begin, it);
        result->append(consecutive_backslash_count + 1, kBackslash);
        span_begin = it;
        consecutive_backslash_count = 0;
        break;
      default:
        consecutive_backslash_count = 0;
        break;
    }
  }
  result->append(span_begin, input.end());
  result->append(consecutive_backslash_count, kBackslash);
  result->push_back(kQuote);
}